

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O0

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>::ComputeShape
          (TPZCompElKernelHDiv3D<pzshape::TPZShapePrism> *this,TPZVec<double> *qsi,
          TPZMaterialData *data)

{
  byte bVar1;
  int iVar2;
  int64_t iVar3;
  pair<int,_long> *ppVar4;
  long in_RDX;
  long index;
  long *in_RDI;
  int j;
  int ncorner;
  int size;
  TPZShapeData *shapedata;
  TPZFMatrix<double> curlHCurl;
  TPZFMatrix<double> phiHCurl;
  int nshape;
  bool needsol;
  size_t in_stack_00000278;
  char *in_stack_00000280;
  TPZFMatrix<double> *in_stack_fffffffffffffe58;
  TPZFNMatrix<110,_double> *in_stack_fffffffffffffe60;
  int local_174;
  double *in_stack_fffffffffffffea8;
  int64_t in_stack_fffffffffffffeb0;
  int64_t in_stack_fffffffffffffeb8;
  TPZFMatrix<double> *in_stack_fffffffffffffec0;
  TPZFMatrix<double> *in_stack_fffffffffffffef8;
  TPZFMatrix<double> *in_stack_ffffffffffffff00;
  REAL in_stack_ffffffffffffff08;
  TPZFMatrix<double> *in_stack_ffffffffffffff10;
  
  bVar1 = *(byte *)(in_RDX + 0x38f8);
  *(undefined1 *)(in_RDX + 0x38f8) = 1;
  iVar2 = (**(code **)(*in_RDI + 600))();
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
             in_stack_fffffffffffffea8);
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,0,in_stack_fffffffffffffea8);
  TPZShapeHCurlNoGrads<pzshape::TPZShapePrism>::Shape
            ((TPZVec<double> *)phiHCurl.fPivot.super_TPZVec<int>.fNElements,
             (TPZShapeData *)phiHCurl.fPivot.super_TPZVec<int>.fStore,
             (TPZFMatrix<double> *)phiHCurl.fPivot.super_TPZVec<int>._vptr_TPZVec,
             (TPZFMatrix<double> *)phiHCurl.fSize);
  TPZCompElHCurl<pzshape::TPZShapePrism>::TransformCurl<3>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  *(byte *)(in_RDX + 0x38f8) = bVar1 & 1;
  iVar3 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDX + 0x3de8));
  if ((int)iVar3 != iVar2) {
    pzinternal::DebugStopImpl(in_stack_00000280,in_stack_00000278);
  }
  TPZFNMatrix<110,_double>::operator=(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  TPZFNMatrix<20,_double>::operator=
            ((TPZFNMatrix<20,_double> *)in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58)
  ;
  TPZFNMatrix<60,_double>::operator=
            ((TPZFNMatrix<60,_double> *)in_stack_fffffffffffffe60,(double)in_stack_fffffffffffffe58)
  ;
  for (local_174 = 0; local_174 < iVar2; local_174 = local_174 + 1) {
    ppVar4 = TPZVec<std::pair<int,_long>_>::operator[]
                       ((TPZVec<std::pair<int,_long>_> *)(in_RDX + 0x42c0),(long)local_174);
    ppVar4->first = local_174;
    index = (long)local_174;
    ppVar4 = TPZVec<std::pair<int,_long>_>::operator[]
                       ((TPZVec<std::pair<int,_long>_> *)(in_RDX + 0x42c0),index);
    ppVar4->second = index;
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1c1e908);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1c1e915);
  return;
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeShape(TPZVec<REAL> &qsi, TPZMaterialData &data){
                                                
    bool needsol = data.fNeedsSol;
    data.fNeedsSol = true;

    auto nshape = this->NShapeF();
    TPZFMatrix<REAL> phiHCurl(3,nshape,0.);
    TPZFMatrix<REAL> curlHCurl(3,nshape,0.);

    TPZShapeHCurlNoGrads<TSHAPE>::Shape(qsi,data,phiHCurl,curlHCurl);
    TPZCompElHCurl<TSHAPE>::TransformCurl(curlHCurl, data.detjac, data.jacobian, data.curlphi);    
    
    data.fNeedsSol = needsol;
    if (TSHAPE::Dimension == 3){        
        TPZShapeData &shapedata = data;
        int size = data.curlphi.Cols();
        if (size != nshape) DebugStop();
        int ncorner = TSHAPE::NCornerNodes;
        data.fDeformedDirections = data.curlphi;
        data.phi = 1.;
        data.dphix = 1.;
        
    } else if (TSHAPE::Dimension == 2) {
        if (data.phi.Rows()>1){
            for (int i = 0; i < data.phi.Rows(); i++){
                data.phi(i,0) = data.curlphi(0,i);
            }
        }
    } else {
        DebugStop();
    }

    for (int j = 0; j < nshape; j++){
        data.fVecShapeIndex[j].first = j;
        data.fVecShapeIndex[j].second = j;
    }

}